

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucky.c
# Opt level: O3

int minimalFlip(word *pInOut,word *pMinimal,word *PDuplicat,int nVars,uint *p_uCanonPhase)

{
  long lVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  size_t __n;
  uint local_3c;
  
  local_3c = *p_uCanonPhase;
  iVar3 = Kit_TruthWordNum_64bit(nVars);
  __n = (size_t)(iVar3 << 3);
  memcpy(pMinimal,pInOut,__n);
  memcpy(PDuplicat,pInOut,__n);
  Kit_TruthChangePhase_64bit(pInOut,nVars,0);
  *(byte *)p_uCanonPhase = (byte)*p_uCanonPhase ^ 1;
  if (1 < nVars) {
    iVar3 = 1;
    do {
      uVar4 = Kit_TruthWordNum_64bit(nVars);
      uVar5 = (ulong)uVar4;
      do {
        if ((int)uVar5 < 1) goto LAB_008fd27f;
        lVar1 = uVar5 - 1;
        lVar2 = uVar5 - 1;
        uVar5 = uVar5 - 1;
      } while (pMinimal[lVar2] == pInOut[lVar1]);
      if (pInOut[lVar1] < pMinimal[lVar2]) {
        memcpy(pMinimal,pInOut,__n);
        local_3c = *p_uCanonPhase;
      }
      else {
LAB_008fd27f:
        memcpy(pInOut,pMinimal,__n);
        *p_uCanonPhase = local_3c;
      }
      Kit_TruthChangePhase_64bit(pInOut,nVars,iVar3);
      *p_uCanonPhase = *p_uCanonPhase ^ 1 << ((byte)iVar3 & 0x1f);
      iVar3 = iVar3 + 1;
    } while (iVar3 != nVars);
  }
  uVar4 = Kit_TruthWordNum_64bit(nVars);
  uVar5 = (ulong)uVar4;
  do {
    if ((int)uVar5 < 1) goto LAB_008fd2e9;
    lVar1 = uVar5 - 1;
    lVar2 = uVar5 - 1;
    uVar5 = uVar5 - 1;
  } while (pMinimal[lVar2] == pInOut[lVar1]);
  if (pMinimal[lVar2] <= pInOut[lVar1]) {
    memcpy(pInOut,pMinimal,__n);
    *p_uCanonPhase = local_3c;
  }
LAB_008fd2e9:
  iVar3 = bcmp(pInOut,PDuplicat,__n);
  return (int)(iVar3 != 0);
}

Assistant:

int minimalFlip(word* pInOut, word* pMinimal, word* PDuplicat, int  nVars, unsigned* p_uCanonPhase)
{
    int i;
    unsigned minTemp = *p_uCanonPhase;
    int blockSize = Kit_TruthWordNum_64bit( nVars )*sizeof(word);
    memcpy(pMinimal, pInOut, (size_t)blockSize);
    memcpy(PDuplicat, pInOut, (size_t)blockSize);       //////////////need one more unsigned!!!!!!!!!!!!!
    Kit_TruthChangePhase_64bit( pInOut, nVars, 0 );
    *p_uCanonPhase ^= (unsigned)1;
    for(i=1;i<nVars;i++)
    {
        if( memCompare(pMinimal,pInOut,nVars) == 1)
        {
            memcpy(pMinimal, pInOut, (size_t)blockSize);
            minTemp = *p_uCanonPhase;
        }
        else
        {
            memcpy(pInOut, pMinimal, (size_t)blockSize);
            *p_uCanonPhase = minTemp;
        }
        Kit_TruthChangePhase_64bit( pInOut, nVars, i );
        *p_uCanonPhase ^= (1 << i);
    }
    if( memCompare(pMinimal,pInOut,nVars) == -1)
    {
        memcpy(pInOut, pMinimal, (size_t)blockSize);
        *p_uCanonPhase = minTemp;
    }
    if(memcmp(pInOut,PDuplicat,(size_t)blockSize) == 0) 
        return 0;
    else
        return 1;
}